

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O3

ClauseIterator __thiscall
Inferences::PrimitiveInstantiation::generateClauses(PrimitiveInstantiation *this,Clause *premise)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int *in_RDX;
  Value VVar5;
  Value unaff_R14;
  FlatMapIter<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65)>_>,_Inferences::PrimitiveInstantiation::IsInstantiable>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn>
  it3;
  undefined1 local_a0 [40];
  OptionBaseRef<Kernel::Literal_**> local_78;
  bool local_70;
  Value local_68;
  MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>
  local_60;
  
  local_60._inner._inn._iter._inner._to = *(uint *)(in_RDX + 0x3c) & 0xfffff;
  local_60._func._index =
       *(PrimitiveInstantiationIndex **)&(premise->super_Unit)._inference.field_0x8;
  local_60._inner._inn._iter._inner._next = 0;
  local_60._inner._inn._iter._inner._from = 0;
  local_60._inner._next.super_OptionBase<Kernel::Literal_*&>.super_OptionBaseRef<Kernel::Literal_**>
  ._elem = (OptionBase<Kernel::Literal_*&>)(OptionBaseRef<Kernel::Literal_**>)0x0;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::PrimitiveInstantiation::IsInstantiable,_false>,_Inferences::PrimitiveInstantiation::ApplicableRewritesFn,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>_>_>
              *)local_a0,&local_60);
  VVar5 = local_68;
  bVar2 = local_70;
  if (local_70 == true) {
    if (local_68 == (Value)0x0) {
      unaff_R14 = (Value)0x0;
    }
    else {
      iVar3 = *(int *)((long)local_68 + 8) + 2;
      *(int *)((long)local_68 + 8) = iVar3;
      if (iVar3 == 0) {
        (**(code **)(*(long *)local_68 + 8))(local_68);
        iVar3 = *(int *)((long)VVar5 + 8);
      }
      *(int *)((long)VVar5 + 8) = iVar3 + -1;
      if (iVar3 + -1 == 0) {
        (**(code **)(*(long *)VVar5 + 8))(VVar5);
        iVar3 = *(int *)((long)VVar5 + 8) + 1;
      }
      *(int *)((long)VVar5 + 8) = iVar3;
      unaff_R14 = VVar5;
    }
  }
  VVar5 = (Value)0x58;
  pp_Var4 = (_func_int **)::operator_new(0x58,8);
  if (bVar2 != false) {
    if (unaff_R14 == (Value)0x0) {
      VVar5 = (Value)0x0;
    }
    else {
      *(int *)((long)unaff_R14 + 8) = *(int *)((long)unaff_R14 + 8) + 1;
      VVar5 = unaff_R14;
    }
  }
  *pp_Var4 = (_func_int *)&PTR__ProxyIterator_00b3a548;
  pp_Var4[2] = in_RDX;
  pp_Var4[3] = (_func_int *)local_a0._0_8_;
  *(undefined4 *)(pp_Var4 + 5) = local_a0._16_4_;
  *(undefined4 *)((long)pp_Var4 + 0x2c) = local_a0._20_4_;
  *(undefined4 *)(pp_Var4 + 6) = local_a0._24_4_;
  *(undefined4 *)((long)pp_Var4 + 0x34) = local_a0._28_4_;
  pp_Var4[7] = (_func_int *)local_a0._32_8_;
  ((OptionBaseRef<Kernel::Literal_**> *)(pp_Var4 + 8))->_elem = local_78._elem;
  *(bool *)(pp_Var4 + 9) = bVar2;
  if (bVar2 == false) {
    (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
    super_InferenceEngine._vptr_InferenceEngine = pp_Var4;
    *(undefined4 *)(pp_Var4 + 1) = 1;
  }
  else {
    *(Value *)(pp_Var4 + 10) = VVar5;
    if (VVar5 == (Value)0x0) {
      (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
      super_InferenceEngine._vptr_InferenceEngine = pp_Var4;
      *(undefined4 *)(pp_Var4 + 1) = 1;
    }
    else {
      iVar3 = *(int *)((long)VVar5 + 8);
      (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
      super_InferenceEngine._vptr_InferenceEngine = pp_Var4;
      *(undefined4 *)(pp_Var4 + 1) = 1;
      if (iVar3 == 0) {
        (**(code **)(*(long *)VVar5 + 8))();
      }
    }
    if (unaff_R14 != (Value)0x0) {
      iVar3 = *(int *)((long)unaff_R14 + 8) + -1;
      *(int *)((long)unaff_R14 + 8) = iVar3;
      if (iVar3 == 0) {
        (**(code **)(*(long *)unaff_R14 + 8))(unaff_R14);
        iVar3 = *(int *)((long)unaff_R14 + 8);
      }
      *(int *)((long)unaff_R14 + 8) = iVar3 + -1;
      if (iVar3 + -1 == 0) {
        (**(code **)(*(long *)unaff_R14 + 8))(unaff_R14);
      }
    }
  }
  if ((local_70 == true) && (local_68 != (Value)0x0)) {
    pcVar1 = (code *)((long)local_68 + 8);
    *(int *)pcVar1 = *(int *)pcVar1 + -1;
    if (*(int *)pcVar1 == 0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator PrimitiveInstantiation::generateClauses(Clause* premise)
{
  //is this correct?
  auto it1 = premise->getSelectedLiteralIterator();
  //filter out literals that are not suitable for narrowing
  auto it2 = getFilteredIterator(it1, IsInstantiable());

  //pair of literals and possible rewrites that can be applied to literals
  auto it3 = getMapAndFlattenIterator(it2, ApplicableRewritesFn(_index));
  
  //apply rewrite rules to literals
  auto it4 = getMappingIterator(it3, ResultFn(premise));
  

  return pvi( it4 );

}